

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mat.cpp
# Opt level: O0

void ncnn::resize_bilinear(Mat *src,Mat *dst,int w,int h,Allocator *allocator,int num_threads)

{
  int iVar1;
  bool bVar2;
  int in_ECX;
  int in_EDX;
  long in_RDI;
  Mat resizem;
  Mat m;
  int q;
  int channels;
  size_t elemsize;
  int in_stack_00000110;
  int in_stack_00000114;
  Mat *in_stack_00000118;
  Mat *in_stack_00000120;
  undefined4 in_stack_ffffffffffffff50;
  int in_stack_ffffffffffffff54;
  Mat *in_stack_ffffffffffffff58;
  undefined4 in_stack_ffffffffffffff60;
  int in_stack_ffffffffffffff64;
  int in_stack_ffffffffffffff68;
  int in_stack_ffffffffffffff6c;
  Mat *in_stack_ffffffffffffff70;
  int local_38;
  
  if ((in_EDX == *(int *)(in_RDI + 0x24)) && (in_ECX == *(int *)(in_RDI + 0x28))) {
    Mat::operator=(in_stack_ffffffffffffff58,
                   (Mat *)CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50));
  }
  else if (*(int *)(in_RDI + 0x20) == 2) {
    Mat::create(in_stack_ffffffffffffff70,in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68,
                CONCAT44(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60),
                (Allocator *)in_stack_ffffffffffffff58);
    bVar2 = Mat::empty((Mat *)CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50));
    if (!bVar2) {
      resize_bilinear_image(in_stack_00000120,in_stack_00000118,in_stack_00000114,in_stack_00000110)
      ;
    }
  }
  else if (*(int *)(in_RDI + 0x20) == 3) {
    iVar1 = *(int *)(in_RDI + 0x2c);
    Mat::create(in_stack_ffffffffffffff70,in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68,
                in_stack_ffffffffffffff64,(size_t)in_stack_ffffffffffffff58,
                (Allocator *)CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50));
    bVar2 = Mat::empty((Mat *)CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50));
    if (!bVar2) {
      for (local_38 = 0; local_38 < iVar1; local_38 = local_38 + 1) {
        Mat::channel(in_stack_ffffffffffffff58,in_stack_ffffffffffffff54);
        Mat::channel(in_stack_ffffffffffffff58,in_stack_ffffffffffffff54);
        resize_bilinear_image
                  (in_stack_00000120,in_stack_00000118,in_stack_00000114,in_stack_00000110);
        Mat::~Mat((Mat *)0x15a6be);
        Mat::~Mat((Mat *)0x15a6c8);
      }
    }
  }
  return;
}

Assistant:

void resize_bilinear(const Mat& src, Mat& dst, int w, int h, Allocator* allocator, int num_threads)
{
    if (w == src.w && h == src.h)
    {
        dst = src;
        return;
    }

    size_t elemsize = src.elemsize;

    if (src.dims == 2)
    {
        dst.create(w, h, elemsize, allocator);
        if (dst.empty())
            return;

        resize_bilinear_image(src, dst, w, h);
    }
    else if (src.dims == 3)
    {
        int channels = src.c;

        dst.create(w, h, channels, elemsize, allocator);
        if (dst.empty())
            return;

        // unroll image channel
        #pragma omp parallel for num_threads(num_threads)
        for (int q=0; q<channels; q++)
        {
            const Mat m = src.channel(q);
            Mat resizem = dst.channel(q);

            resize_bilinear_image(m, resizem, w, h);
        }
    }
}